

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTextCharFormat>::copyAppend
          (QGenericArrayOps<QTextCharFormat> *this,qsizetype n,parameter_type t)

{
  QTextCharFormat *pQVar1;
  qsizetype qVar2;
  
  if (n != 0) {
    pQVar1 = (this->super_QArrayDataPointer<QTextCharFormat>).ptr;
    qVar2 = (this->super_QArrayDataPointer<QTextCharFormat>).size;
    do {
      QTextFormat::QTextFormat(&pQVar1[qVar2].super_QTextFormat,&t->super_QTextFormat);
      qVar2 = (this->super_QArrayDataPointer<QTextCharFormat>).size + 1;
      (this->super_QArrayDataPointer<QTextCharFormat>).size = qVar2;
      n = n + -1;
    } while (n != 0);
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t)
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *data = this->begin();
        while (n--) {
            new (data + this->size) T(t);
            ++this->size;
        }
    }